

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  byte bVar1;
  int *piVar2;
  int n;
  u8 opcode;
  int *aLabel;
  Op *pOp;
  int nMaxArgs;
  int i;
  int *pMaxFuncArgs_local;
  Vdbe *p_local;
  
  pOp._0_4_ = *pMaxFuncArgs;
  piVar2 = p->aLabel;
  *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a & 0xfeff | 0x100;
  aLabel = (int *)p->aOp;
  pOp._4_4_ = p->nOp;
  while (pOp._4_4_ = pOp._4_4_ + -1, -1 < pOp._4_4_) {
    bVar1 = (byte)*aLabel;
    *(uchar *)((long)aLabel + 2) = ""[bVar1];
    if ((bVar1 == 0x12) || (bVar1 == 0x7b)) {
      if ((int)(uint)pOp < (int)(uint)*(byte *)((long)aLabel + 3)) {
        pOp._0_4_ = (uint)*(byte *)((long)aLabel + 3);
      }
    }
    else if (((bVar1 == 0x23) && (aLabel[2] != 0)) || (bVar1 == 0x7f)) {
      *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a & 0xfeff;
    }
    else if (bVar1 == 0x8c) {
      if ((int)(uint)pOp < aLabel[2]) {
        pOp._0_4_ = aLabel[2];
      }
    }
    else if (bVar1 == 0x88) {
      if ((int)(uint)pOp < aLabel[-5]) {
        pOp._0_4_ = aLabel[-5];
      }
    }
    else if ((bVar1 == 0x5f) || (bVar1 == 0x51)) {
      *(code **)(aLabel + 4) = sqlite3BtreeNext;
      *(undefined1 *)((long)aLabel + 1) = 0xed;
    }
    else if (bVar1 == 0x5c) {
      *(code **)(aLabel + 4) = sqlite3BtreePrevious;
      *(undefined1 *)((long)aLabel + 1) = 0xed;
    }
    if (((*aLabel & 0x10000) != 0) && (aLabel[2] < 0)) {
      aLabel[2] = piVar2[-1 - aLabel[2]];
    }
    aLabel = aLabel + 6;
  }
  sqlite3DbFree(p->db,p->aLabel);
  p->aLabel = (int *)0x0;
  *pMaxFuncArgs = (uint)pOp;
  return;
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int i;
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  int *aLabel = p->aLabel;
  p->readOnly = 1;
  for(pOp=p->aOp, i=p->nOp-1; i>=0; i--, pOp++){
    u8 opcode = pOp->opcode;

    pOp->opflags = sqlite3OpcodeProperty[opcode];
    if( opcode==OP_Function || opcode==OP_AggStep ){
      if( pOp->p5>nMaxArgs ) nMaxArgs = pOp->p5;
    }else if( (opcode==OP_Transaction && pOp->p2!=0) || opcode==OP_Vacuum ){
      p->readOnly = 0;
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( opcode==OP_VUpdate ){
      if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
    }else if( opcode==OP_VFilter ){
      int n;
      assert( p->nOp - i >= 3 );
      assert( pOp[-1].opcode==OP_Integer );
      n = pOp[-1].p1;
      if( n>nMaxArgs ) nMaxArgs = n;
#endif
    }else if( opcode==OP_Next || opcode==OP_SorterNext ){
      pOp->p4.xAdvance = sqlite3BtreeNext;
      pOp->p4type = P4_ADVANCE;
    }else if( opcode==OP_Prev ){
      pOp->p4.xAdvance = sqlite3BtreePrevious;
      pOp->p4type = P4_ADVANCE;
    }

    if( (pOp->opflags & OPFLG_JUMP)!=0 && pOp->p2<0 ){
      assert( -1-pOp->p2<p->nLabel );
      pOp->p2 = aLabel[-1-pOp->p2];
    }
  }
  sqlite3DbFree(p->db, p->aLabel);
  p->aLabel = 0;

  *pMaxFuncArgs = nMaxArgs;
}